

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O2

_Bool COSE_Enveloped_SetExternal
                (HCOSE_ENVELOPED hcose,byte *pbExternalData,size_t cbExternalData,cose_errback *perr
                )

{
  _Bool _Var1;
  
  _Var1 = IsValidEnvelopedHandle(hcose);
  if (_Var1) {
    if (cbExternalData == 0 || pbExternalData != (byte *)0x0) {
      _Var1 = _COSE_SetExternal((COSE *)hcose,pbExternalData,cbExternalData,perr);
      return _Var1;
    }
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Enveloped_SetExternal(HCOSE_ENVELOPED hcose, const byte * pbExternalData, size_t cbExternalData, cose_errback * perr)
{
	CHECK_CONDITION(IsValidEnvelopedHandle(hcose), COSE_ERR_INVALID_HANDLE)
	CHECK_CONDITION((pbExternalData != NULL) || (cbExternalData == 0), COSE_ERR_INVALID_PARAMETER);

	return _COSE_SetExternal(&((COSE_Enveloped *)hcose)->m_message, pbExternalData, cbExternalData, perr);

errorReturn:
	return false;
}